

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GeneratePrivateMembers
          (SingularString *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  bool bVar1;
  Sub *local_180;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  undefined1 local_139;
  char *local_138 [3];
  allocator<char> local_119;
  string local_118;
  Sub *local_f8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  undefined1 local_18 [8];
  Printer *p_local;
  SingularString *this_local;
  
  local_139 = 1;
  local_f8 = &local_f0;
  local_18 = (undefined1  [8])p;
  p_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"Str",&local_119);
  bVar1 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
  local_138[0] = "ArenaStringPtr";
  if (bVar1) {
    local_138[0] = "InlinedStringField";
  }
  io::Printer::Sub::Sub<char_const*>(&local_f0,&local_118,local_138);
  local_139 = 0;
  local_38 = &local_f0;
  local_30 = 1;
  v._M_len = 1;
  v._M_array = local_38;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_28._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_150,"\n              $pbi$::$Str$ $name$_;\n            ");
  io::Printer::SourceLocation::current();
  google::protobuf::io::Printer::Emit
            (p,local_28._M_allocated_capacity,local_28._8_8_,local_150._M_len,local_150._M_str);
  local_180 = (Sub *)&local_38;
  do {
    local_180 = local_180 + -1;
    io::Printer::Sub::~Sub(local_180);
  } while (local_180 != &local_f0);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  return;
}

Assistant:

void GeneratePrivateMembers(io::Printer* p) const override {
    // Skips the automatic destruction if inlined; rather calls it explicitly if
    // allocating arena is null.
    p->Emit({{"Str", is_inlined() ? "InlinedStringField" : "ArenaStringPtr"}},
            R"cc(
              $pbi$::$Str$ $name$_;
            )cc");
  }